

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::CreateCDCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *tgtDir,string *relDir)

{
  pointer pbVar1;
  __type _Var2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *__s;
  cmOutputConverter *this_01;
  pointer __rhs;
  string outputForExisting;
  string cmd;
  string prefix;
  string sStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &sStack_88;
  _Var2 = std::operator==(tgtDir,relDir);
  if (!_Var2) {
    bVar3 = cmLocalGenerator::IsMinGWMake((cmLocalGenerator *)this);
    __s = "cd ";
    if (bVar3) {
      __s = "cd /d ";
    }
    if ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
        MakeSilentFlag.field_2._M_local_buf[2] == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,__s,(allocator<char> *)&sStack_88);
      this_01 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
      ;
      cmOutputConverter::ConvertToOutputForExisting(&sStack_88,this_01,tgtDir,SHELL);
      std::__cxx11::string::append((string *)&local_68);
      std::__cxx11::string::~string((string *)&sStack_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(commands,(commands->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,&local_68);
      std::__cxx11::string::assign((char *)&local_68);
      cmOutputConverter::ConvertToOutputForExisting(&sStack_88,this_01,relDir,SHELL);
      std::__cxx11::string::append((string *)&local_68);
      std::__cxx11::string::~string((string *)&sStack_88);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
                 &local_68);
      this_00 = &local_68;
    }
    else {
      cmOutputConverter::ConvertToOutputForExisting
                (&sStack_88,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,tgtDir,SHELL);
      std::operator+(&local_68,__s,&sStack_88);
      std::operator+(&local_48,&local_68," && ");
      std::__cxx11::string::~string((string *)&local_68);
      pbVar1 = (commands->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (__rhs = (commands->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar1; __rhs = __rhs + 1) {
        std::operator+(&local_68,&local_48,__rhs);
        std::__cxx11::string::operator=((string *)__rhs,(string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
      }
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::CreateCDCommand(
  std::vector<std::string>& commands, std::string const& tgtDir,
  std::string const& relDir)
{
  // do we need to cd?
  if (tgtDir == relDir) {
    return;
  }

  // In a Windows shell we must change drive letter too.  The shell
  // used by NMake and Borland make does not support "cd /d" so this
  // feature simply cannot work with them (Borland make does not even
  // support changing the drive letter with just "d:").
  const char* cd_cmd = this->IsMinGWMake() ? "cd /d " : "cd ";

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  if (!gg->UnixCD) {
    // On Windows we must perform each step separately and then change
    // back because the shell keeps the working directory between
    // commands.
    std::string cmd = cd_cmd;
    cmd += this->ConvertToOutputForExisting(tgtDir);
    commands.insert(commands.begin(), cmd);

    // Change back to the starting directory.
    cmd = cd_cmd;
    cmd += this->ConvertToOutputForExisting(relDir);
    commands.push_back(std::move(cmd));
  } else {
    // On UNIX we must construct a single shell command to change
    // directory and build because make resets the directory between
    // each command.
    std::string outputForExisting = this->ConvertToOutputForExisting(tgtDir);
    std::string prefix = cd_cmd + outputForExisting + " && ";
    std::transform(commands.begin(), commands.end(), commands.begin(),
                   [&prefix](std::string const& s) { return prefix + s; });
  }
}